

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_system.cpp
# Opt level: O1

int I_FindClose(void *handle)

{
  findstate_t *state;
  long lVar1;
  
  if ((handle != (void *)0xffffffffffffffff) && (0 < *handle)) {
    if (0 < *handle) {
      lVar1 = 0;
      do {
        free(*(void **)(*(long *)((long)handle + 8) + lVar1 * 8));
        lVar1 = lVar1 + 1;
      } while (lVar1 < *handle);
    }
    *(undefined4 *)handle = 0;
    free(*(void **)((long)handle + 8));
    *(undefined8 *)((long)handle + 8) = 0;
  }
  return 0;
}

Assistant:

int I_FindClose (void *handle)
{
	findstate_t *state = (findstate_t *)handle;
	if (handle != (void*)-1 && state->count > 0)
	{
		for(int i = 0;i < state->count;++i)
			free (state->namelist[i]);
		state->count = 0;
		free (state->namelist);
		state->namelist = NULL;
	}
	return 0;
}